

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructPackCall_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,string *prefix)

{
  StructDef *struct_def_00;
  bool bVar1;
  reference ppFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Value *local_50;
  Type *field_type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_38;
  const_iterator it;
  string *code;
  string *prefix_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  it._M_current = (FieldDef **)code_ptr;
  local_38._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_38);
    field_type = (Type *)*ppFVar2;
    local_50 = &((FieldDef *)field_type)->value;
    if ((((FieldDef *)field_type)->value).type.struct_def == (StructDef *)0x0) {
      std::__cxx11::string::operator+=((string *)it._M_current,",\n");
      std::operator+(&local_c0,prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field_type
                    );
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      struct_def_00 = (((FieldDef *)field_type)->value).type.struct_def;
      std::operator+(&local_90,prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field_type
                    );
      std::operator+(&local_70,&local_90,"_");
      GenStructPackCall_ObjectAPI(this,struct_def_00,code_ptr,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void GenStructPackCall_ObjectAPI(const StructDef &struct_def,
                                   std::string *code_ptr,
                                   std::string prefix) const {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field_type.struct_def != nullptr) {
        GenStructPackCall_ObjectAPI(*field_type.struct_def, code_ptr,
                                    prefix + field.name + "_");
      } else {
        code += ",\n";
        code += prefix + field.name;
      }
    }
  }